

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscrete.h
# Opt level: O2

Interface_ProblemToPolicyDiscrete * __thiscall
JointPolicyDiscrete::GetInterfacePTPDiscrete(JointPolicyDiscrete *this)

{
  ostream *poVar1;
  Interface_ProblemToPolicyDiscrete *pIVar2;
  
  if ((this->_m_PTPDshared).px == (element_type *)0x0) {
    pIVar2 = (Interface_ProblemToPolicyDiscrete *)0x0;
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Calling GetInterfacePTPDiscrete(), should use GetInterfacePTPDiscreteShared() instead"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    pIVar2 = (this->_m_PTPDshared).px;
  }
  if (this->_m_PTPD != (Interface_ProblemToPolicyDiscrete *)0x0) {
    pIVar2 = this->_m_PTPD;
  }
  return pIVar2;
}

Assistant:

const Interface_ProblemToPolicyDiscrete* GetInterfacePTPDiscrete() const
        {
            if(_m_PTPDshared!=0)
                std::cerr << "Calling GetInterfacePTPDiscrete(), should use GetInterfacePTPDiscreteShared() instead"
                          << std::endl;

            if(_m_PTPD)
                return _m_PTPD;
            else
                return _m_PTPDshared.get();
        }